

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::anon_unknown_14::translateActiveException(void)

{
  bool bVar1;
  uint uVar2;
  reference ppIVar3;
  reference ppIVar4;
  ContextOptions *pCVar5;
  undefined7 uVar6;
  String *in_RDI;
  __normal_iterator<const_doctest::detail::IExceptionTranslator_**,_std::vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>_>
  *p_Var7;
  exception *ex;
  string *msg;
  char *msg_1;
  IExceptionTranslator **curr;
  iterator __end2;
  iterator __begin2;
  vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
  *__range2;
  vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
  *translators;
  String res;
  undefined6 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe66;
  undefined1 in_stack_fffffffffffffe67;
  byte bVar8;
  String *in_stack_fffffffffffffe68;
  String *in_stack_fffffffffffffe70;
  String *in_stack_fffffffffffffe78;
  bool bStack_161;
  String *in_stack_fffffffffffffea8;
  String *in_stack_fffffffffffffeb0;
  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
  _Stack_148;
  long lStack_140;
  String aSStack_120 [3];
  String SStack_d8;
  byte bStack_a9;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  String *this;
  String *in_stack_ffffffffffffff90;
  __normal_iterator<const_doctest::detail::IExceptionTranslator_**,_std::vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>_>
  local_38;
  vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
  *local_30;
  vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
  *local_28;
  undefined1 local_20 [32];
  
  this = in_RDI;
  String::String((String *)0x761f06);
  local_30 = getExceptionTranslators();
  local_28 = local_30;
  local_38._M_current =
       (IExceptionTranslator **)
       std::
       vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
       ::begin((vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
                *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  std::
  vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
  ::end((vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
         *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  while( true ) {
    p_Var7 = &local_38;
    bVar1 = __gnu_cxx::
            operator==<const_doctest::detail::IExceptionTranslator_**,_std::vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>_>
                      ((__normal_iterator<const_doctest::detail::IExceptionTranslator_**,_std::vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>_>
                        *)this,(__normal_iterator<const_doctest::detail::IExceptionTranslator_**,_std::vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>_>
                                *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __cxa_rethrow();
      if (((ulong)p_Var7[1]._M_current & 0x10) == 0) {
        if ((((ulong)p_Var7[1]._M_current & 0x20) == 0) ||
           (((ulong)p_Var7[1]._M_current & 0x40) == 0)) {
          if (((ulong)p_Var7[1]._M_current & 0x20) == 0) {
            if (((ulong)p_Var7[1]._M_current & 0x40) == 0) {
              if (((ulong)p_Var7[1]._M_current & 0x80) != 0) {
                *(byte *)&p_Var7[5]._M_current = *(byte *)((long)&p_Var7[5]._M_current + 1) & 1;
              }
            }
            else {
              in_stack_fffffffffffffe70 = (String *)(p_Var7 + 6);
              in_stack_fffffffffffffe78 = &SStack_d8;
              String::String(in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
              bVar1 = operator!=(in_stack_fffffffffffffe68,
                                 (String *)
                                 CONCAT17(in_stack_fffffffffffffe67,
                                          CONCAT16(in_stack_fffffffffffffe66,
                                                   in_stack_fffffffffffffe60)));
              *(bool *)&p_Var7[5]._M_current = bVar1;
              String::~String(in_stack_fffffffffffffe78);
            }
          }
          else {
            *(byte *)&p_Var7[5]._M_current = (*(byte *)&p_Var7[0xc]._M_current ^ 0xff) & 1;
          }
        }
        else {
          bStack_a9 = 0;
          bStack_161 = true;
          if (((ulong)p_Var7[0xc]._M_current & 1) != 0) {
            String::String(in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
            bStack_a9 = 1;
            bStack_161 = operator!=(in_stack_fffffffffffffe68,
                                    (String *)
                                    CONCAT17(in_stack_fffffffffffffe67,
                                             CONCAT16(in_stack_fffffffffffffe66,
                                                      in_stack_fffffffffffffe60)));
          }
          *(bool *)&p_Var7[5]._M_current = bStack_161;
          if ((bStack_a9 & 1) != 0) {
            String::~String(in_stack_fffffffffffffe78);
          }
        }
      }
      else {
        *(byte *)&p_Var7[5]._M_current = (*(byte *)((long)&p_Var7[5]._M_current + 1) ^ 0xff) & 1;
      }
      uVar2 = String::size((String *)
                           CONCAT17(in_stack_fffffffffffffe67,
                                    CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)));
      if (uVar2 != 0) {
        in_stack_fffffffffffffe68 = aSStack_120;
        String::String(in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
        doctest::operator+(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        String::String(in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
        doctest::operator+(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        String::operator=(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
        String::~String(in_stack_fffffffffffffe78);
        String::~String(in_stack_fffffffffffffe78);
        String::~String(in_stack_fffffffffffffe78);
        String::~String(in_stack_fffffffffffffe78);
      }
      if ((is_running_in_test & 1) == 0) {
        if (((ulong)p_Var7[5]._M_current & 1) != 0) {
          doctest::detail::failed_out_of_a_testing_context((AssertData *)0x762593);
        }
      }
      else {
        addAssert(0);
        lStack_140 = doctest::detail::g_cs + 0x10d0;
        _Stack_148._M_current =
             (IReporter **)
             std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin
                       ((vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)
                        CONCAT17(in_stack_fffffffffffffe67,
                                 CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)));
        std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end
                  ((vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)
                   CONCAT17(in_stack_fffffffffffffe67,
                            CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)));
        while (bVar1 = __gnu_cxx::
                       operator==<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                 ((__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                   *)in_stack_fffffffffffffe68,
                                  (__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffe67,
                                              CONCAT16(in_stack_fffffffffffffe66,
                                                       in_stack_fffffffffffffe60))),
              ((bVar1 ^ 0xffU) & 1) != 0) {
          ppIVar4 = __gnu_cxx::
                    __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                    ::operator*(&_Stack_148);
          (*(*ppIVar4)->_vptr_IReporter[9])(*ppIVar4,p_Var7);
          __gnu_cxx::
          __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
          ::operator++(&_Stack_148);
        }
        if (((ulong)p_Var7[5]._M_current & 1) != 0) {
          addFailedAssert(0);
        }
      }
      uVar6 = 0;
      bVar8 = 0;
      if (((ulong)p_Var7[5]._M_current & 1) != 0) {
        bVar1 = doctest::detail::isDebuggerActive();
        uVar6 = 0;
        bVar8 = 0;
        if (bVar1) {
          pCVar5 = getContextOptions();
          uVar6 = 0;
          bVar8 = 0;
          if ((pCVar5->no_breaks & 1U) == 0) {
            uVar6 = 0;
            bVar8 = 1;
            if (*(long *)(doctest::detail::g_cs + 0x20) != 0) {
              uVar6 = (undefined7)((ulong)*(long *)(doctest::detail::g_cs + 0x20) >> 8);
              bVar8 = *(byte *)(*(long *)(doctest::detail::g_cs + 0x20) + 0x39) ^ 0xff;
            }
          }
        }
      }
      return (String *)(CONCAT71(uVar6,bVar8) & 0xffffffffffffff01);
    }
    ppIVar3 = __gnu_cxx::
              __normal_iterator<const_doctest::detail::IExceptionTranslator_**,_std::vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>_>
              ::operator*(&local_38);
    uVar2 = (*(*ppIVar3)->_vptr_IExceptionTranslator[2])(*ppIVar3,local_20);
    in_stack_ffffffffffffff7f = (undefined1)uVar2;
    if ((uVar2 & 1) != 0) break;
    __gnu_cxx::
    __normal_iterator<const_doctest::detail::IExceptionTranslator_**,_std::vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>_>
    ::operator++(&local_38);
  }
  String::String(this,(String *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  String::~String(in_stack_ffffffffffffff90);
  return in_RDI;
}

Assistant:

String translateActiveException() {
#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
        String res;
        auto&  translators = getExceptionTranslators();
        for(auto& curr : translators)
            if(curr->translate(res))
                return res;
        // clang-format off
        DOCTEST_GCC_SUPPRESS_WARNING_WITH_PUSH("-Wcatch-value")
        try {
            throw;
        } catch(std::exception& ex) {
            return ex.what();
        } catch(std::string& msg) {
            return msg.c_str();
        } catch(const char* msg) {
            return msg;
        } catch(...) {
            return "unknown exception";
        }
        DOCTEST_GCC_SUPPRESS_WARNING_POP
// clang-format on
#else  // DOCTEST_CONFIG_NO_EXCEPTIONS
        return "";
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS
    }